

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BigNum * solve_system(BigNum *__return_storage_ptr__,
                     vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                     *equations)

{
  pointer ppVar1;
  ostream *poVar2;
  pointer ppVar3;
  BigNum *this;
  BigNum all_mod;
  pair<BigNum,_BigNum> equation;
  BigNum local_2d0;
  BigNum local_2b0;
  BigNum local_290;
  BigNum local_270;
  BigNum local_250;
  BigNum local_230;
  pair<BigNum,_BigNum> local_210;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum new_first;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Solving system of ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," equations:");
  std::endl<char,std::char_traits<char>>(poVar2);
  ppVar1 = (equations->
           super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (equations->
                super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    std::pair<BigNum,_BigNum>::pair(&equation,ppVar3);
    std::operator<<((ostream *)&std::cout,"x = ");
    BigNum::BigNum(&local_50,&equation.first);
    print(&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    std::operator<<((ostream *)&std::cout," (mod ");
    BigNum::BigNum(&local_70,&equation.second);
    print(&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    poVar2 = std::operator<<((ostream *)&std::cout,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::pair<BigNum,_BigNum>::~pair(&equation);
  }
  BigNum::BigNum(&all_mod,1);
  BigNum::BigNum(__return_storage_ptr__,0);
  ppVar1 = (equations->
           super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (equations->
                super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    std::pair<BigNum,_BigNum>::pair(&equation,ppVar3);
    BigNum::BigNum(&local_110,&equation.first);
    BigNum::BigNum(&local_90,__return_storage_ptr__);
    operator-(&new_first,&local_110,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    this = &local_110;
    while( true ) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)this);
      if (new_first.sign != false) break;
      BigNum::BigNum(&local_b0,&new_first);
      BigNum::BigNum(&local_d0,&equation.second);
      operator+(&local_210.first,&local_b0,&local_d0);
      BigNum::operator=(&new_first,&local_210.first);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_210);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
      this = &local_b0;
    }
    BigNum::BigNum(&local_230,&new_first);
    BigNum::BigNum(&local_250,&all_mod);
    BigNum::BigNum(&local_150,&equation.second);
    reverseByMod(&local_130,&local_250,&local_150);
    operator*(&local_210.first,&local_230,&local_130);
    BigNum::operator=(&new_first,&local_210.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_210);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_250);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
    BigNum::BigNum(&local_270,&new_first);
    BigNum::BigNum(&local_170,&equation.second);
    pairDivMod(&local_210,&local_270,&local_170);
    BigNum::operator=(&new_first,&local_210.second);
    std::pair<BigNum,_BigNum>::~pair(&local_210);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_270);
    BigNum::BigNum(&local_290,__return_storage_ptr__);
    BigNum::BigNum(&local_2b0,&new_first);
    BigNum::BigNum(&local_1b0,&all_mod);
    operator*(&local_190,&local_2b0,&local_1b0);
    operator+(&local_210.first,&local_290,&local_190);
    BigNum::operator=(__return_storage_ptr__,&local_210.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_210);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_190);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_290);
    BigNum::BigNum(&local_2d0,&all_mod);
    BigNum::BigNum(&local_1d0,&equation.second);
    operator*(&local_210.first,&local_2d0,&local_1d0);
    BigNum::operator=(&all_mod,&local_210.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_210);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&new_first);
    std::pair<BigNum,_BigNum>::~pair(&equation);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&all_mod);
  return __return_storage_ptr__;
}

Assistant:

BigNum solve_system(vector<std::pair<BigNum, BigNum>> equations){ // num and mod
    cout << "Solving system of " << equations.size() << " equations:" << endl;
    for(auto equation : equations){
        cout << "x = ";
        print(equation.first);
        cout <<  " (mod ";
        print(equation.second);
        cout << ");" << endl;
    }
    BigNum all_mod = BigNum(1);
    BigNum result = BigNum(0);
    for (auto pr : equations){
        BigNum new_first = (pr.first - result);
        while (!new_first.sign){
            new_first = new_first + pr.second;
        }
        new_first = new_first * reverseByMod(all_mod, pr.second);
        new_first = pairDivMod(new_first, pr.second).second;
        result = result + new_first * all_mod; // 2 17
        all_mod = all_mod * pr.second; // 5 35
    }
    return result;
}